

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O2

void __thiscall
crnlib::sparse_bit_array::clear_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint *puVar1;
  uint32 **ppuVar2;
  void *p;
  uint32 *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (num != 0) {
    uVar5 = (ulong)index;
    if (num == 1) {
      clear_bit(this,index);
      return;
    }
    ppuVar2 = this->m_ppGroups;
    do {
      uVar4 = (uint)uVar5;
      uVar6 = num;
      if (0x200 < num && (uVar5 & 0x1ff) == 0) {
        for (; ppuVar2 = this->m_ppGroups, 0x1ff < uVar6; uVar6 = uVar6 - 0x200) {
          p = *(void **)((long)ppuVar2 + (uVar5 >> 6));
          if (p != (void *)0x0) {
            crnlib_free(p);
            this->m_ppGroups[uVar5 >> 9] = (uint32 *)0x0;
          }
          uVar5 = (ulong)((int)uVar5 + 0x200);
        }
        for (uVar6 = num & 0x1ff; uVar6 != 0; uVar6 = uVar6 - uVar4) {
          uVar4 = 0x20;
          if (uVar6 < 0x20) {
            uVar4 = uVar6;
          }
          puVar3 = ppuVar2[uVar5 >> 9];
          if (puVar3 != (uint32 *)0x0) {
            puVar1 = (uint *)((long)puVar3 + (ulong)((uint)(uVar5 >> 3) & 0x3c));
            *puVar1 = *puVar1 & ~((0xffffffffU >> (-(char)uVar4 & 0x1fU)) << ((byte)uVar5 & 0x1f));
          }
          uVar5 = (ulong)((int)uVar5 + uVar4);
        }
        return;
      }
      uVar6 = 0x20 - (uVar4 & 0x1f);
      if (num <= uVar6) {
        uVar6 = num;
      }
      if (ppuVar2[uVar5 >> 9] != (uint32 *)0x0) {
        puVar1 = ppuVar2[uVar5 >> 9] + ((uVar4 & 0x1ff) >> 5);
        *puVar1 = *puVar1 & ~((0xffffffffU >> (-(char)uVar6 & 0x1fU)) << (sbyte)(uVar4 & 0x1f));
      }
      uVar5 = (ulong)(uVar4 + uVar6);
      num = num - uVar6;
    } while (num != 0);
  }
  return;
}

Assistant:

void sparse_bit_array::clear_bit_range(uint index, uint num)
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return;
        }
        else if (num == 1)
        {
            clear_bit(index);
            return;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;

            const uint dword_bit_ofs = group_bit_ofs & 31;
            const uint max_bits_to_set = 32 - dword_bit_ofs;

            const uint bits_to_set = math::minimum(max_bits_to_set, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));
                pGroup[group_bit_ofs >> 5] &= (~(msk << dword_bit_ofs));
            }

            num -= bits_to_set;
            if (!num)
            {
                return;
            }

            index += bits_to_set;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                free_group(pGroup);
                m_ppGroups[group_index] = nullptr;
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_set = math::minimum(32u, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

                pGroup[group_bit_ofs >> 5] &= (~(msk << (group_bit_ofs & 31)));
            }

            num -= bits_to_set;
            index += bits_to_set;
        }
    }